

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

char * msort(char *list,char **next,_func_int_char_ptr_char_ptr *cmp)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  char *set [30];
  undefined8 local_118 [31];
  
  memset(local_118,0,0xf0);
  lVar4 = (long)next - (long)list;
  do {
    if (list == (char *)0x0) {
      lVar5 = 0;
      pcVar2 = (char *)0x0;
      do {
        if ((char *)local_118[lVar5] != (char *)0x0) {
          pcVar2 = merge((char *)local_118[lVar5],pcVar2,cmp,(int)lVar4);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x1e);
      return pcVar2;
    }
    pcVar1 = *(char **)(list + lVar4);
    pcVar2 = list + lVar4;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
    uVar3 = 0;
    do {
      if ((char *)local_118[uVar3] == (char *)0x0) goto LAB_00104691;
      list = merge(list,(char *)local_118[uVar3],cmp,(int)lVar4);
      local_118[uVar3] = 0;
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x1d);
    uVar3 = 0x1d;
LAB_00104691:
    local_118[uVar3 & 0xffffffff] = list;
    list = pcVar1;
  } while( true );
}

Assistant:

static char *msort(
  char *list,
  char **next,
  int (*cmp)(const char*,const char*)
){
  unsigned long offset;
  char *ep;
  char *set[LISTSIZE];
  int i;
  offset = (unsigned long)((char*)next - (char*)list);
  for(i=0; i<LISTSIZE; i++) set[i] = 0;
  while( list ){
    ep = list;
    list = NEXT(list);
    NEXT(ep) = 0;
    for(i=0; i<LISTSIZE-1 && set[i]!=0; i++){
      ep = merge(ep,set[i],cmp,offset);
      set[i] = 0;
    }
    set[i] = ep;
  }
  ep = 0;
  for(i=0; i<LISTSIZE; i++) if( set[i] ) ep = merge(set[i],ep,cmp,offset);
  return ep;
}